

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

int perfetto::internal::TrackEventInternal::GetSessionCount(void)

{
  memory_order __b;
  
  ::std::operator&(memory_order_seq_cst,__memory_order_mask);
  return session_count_;
}

Assistant:

int TrackEventInternal::GetSessionCount() {
  return session_count_.load();
}